

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::SingularVarBigint<long,unsigned_char,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong *puVar5;
  ushort *ptr_00;
  uint *puVar6;
  ulong uVar7;
  
  if (-1 < (long)*ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar3 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar3 < 0) {
    uVar7 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar7 < 0) {
      uVar3 = uVar3 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar3 < 0) {
        uVar7 = uVar7 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar7 < 0) {
          uVar3 = uVar3 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar3 < 0) {
            uVar7 = uVar7 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar7 < 0) {
              uVar3 = uVar3 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar3 < 0) {
                uVar7 = uVar7 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar7 < 0) {
                  bVar1 = ptr[9];
                  ptr_00 = (ushort *)(ptr + 10);
                  if (bVar1 != 1) {
                    if ((char)bVar1 < '\0') {
                      pcVar4 = Error(msg,(char *)ptr_00,ctx,data,table,hasbits);
                      return pcVar4;
                    }
                    if ((bVar1 & 1) == 0) {
                      uVar7 = uVar7 ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  ptr_00 = (ushort *)(ptr + 9);
                }
              }
              else {
                ptr_00 = (ushort *)(ptr + 8);
              }
            }
            else {
              ptr_00 = (ushort *)(ptr + 7);
            }
          }
          else {
            ptr_00 = (ushort *)(ptr + 6);
          }
        }
        else {
          ptr_00 = (ushort *)(ptr + 5);
        }
      }
      else {
        ptr_00 = (ushort *)(ptr + 4);
      }
    }
    else {
      ptr_00 = (ushort *)(ptr + 3);
    }
    uVar3 = uVar3 & uVar7;
  }
  else {
    ptr_00 = (ushort *)(ptr + 2);
  }
  puVar5 = (ulong *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar5 & 7) != 0) {
    AlignFail(puVar5);
  }
  uVar3 = uVar3 & (long)*ptr;
  *puVar5 = -(ulong)((uint)uVar3 & 1) ^ uVar3 >> 1;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr_00) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) {
        AlignFail();
      }
      *puVar6 = *puVar6 | (uint)hasbits;
    }
    return (char *)ptr_00;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*ptr_00;
  if ((uVar2 & 7) == 0) {
    pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar2 & 0xfffffff8)))();
    return pcVar4;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}